

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O3

void Eigen::internal::triangular_solve_matrix<float,_long,_1,_2,_false,_0,_0,_1>::run
               (long size,long otherSize,float *_tri,long triStride,float *_other,long otherIncr,
               long otherStride,level3_blocking<float,_float> *blocking)

{
  float fVar1;
  RhsScalar *pRVar2;
  float *cols;
  ulong stride;
  int iVar3;
  LhsScalar *pLVar4;
  undefined8 *puVar5;
  ulong uVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  LhsScalar *pLVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  float *pfVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  float afStack_198 [2];
  long local_190;
  ulong local_188;
  float *local_180;
  long local_178;
  float *local_170;
  float *local_168;
  long local_160;
  long local_158;
  long local_150;
  long startTarget;
  long local_140;
  long local_138;
  RhsScalar *local_130;
  float *local_128;
  float *local_120;
  float *local_118;
  long local_110;
  float *local_108;
  float *local_100;
  ulong local_f8;
  LhsScalar *local_f0;
  RhsScalar *local_e8;
  long local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  long local_b8;
  ulong local_b0;
  float *local_a8;
  RhsScalar *local_a0;
  ulong local_98;
  float *local_90;
  long local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  LhsScalar *local_68;
  long local_60;
  gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
  local_51;
  undefined1 auStack_50 [7];
  gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
  local_32;
  gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
  local_31 [7];
  gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
  pack_lhs;
  
  pLVar11 = afStack_198;
  local_d8 = _tri;
  if (otherIncr != 1) {
    __assert_fail("incr==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/BlasUtil.h"
                  ,0xae,
                  "Eigen::internal::blas_data_mapper<float, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = float, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
                 );
  }
  local_b8 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    local_b8 = size;
  }
  uVar19 = local_b8 * blocking->m_kc;
  if (uVar19 >> 0x3e != 0) {
LAB_00167fd4:
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = boost::program_options::detail::cmdline::cmdline;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_68 = blocking->m_blockA;
  local_60 = otherSize;
  local_98 = blocking->m_kc;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar19 < 0x8001) {
      pLVar4 = (LhsScalar *)((long)afStack_198 - (uVar19 * 4 + 0x1e & 0xfffffffffffffff0));
      local_68 = pLVar4;
      pLVar11 = pLVar4;
    }
    else {
      pLVar4 = (LhsScalar *)malloc(uVar19 * 4);
      if (((ulong)pLVar4 & 0xf) != 0) goto LAB_0016806c;
      local_68 = pLVar4;
      pLVar11 = afStack_198;
      if (pLVar4 == (LhsScalar *)0x0) goto LAB_00167fd4;
    }
  }
  else {
    pLVar4 = (LhsScalar *)0x0;
    pLVar11 = afStack_198;
  }
  uVar6 = local_98 * local_60;
  local_b0 = uVar6;
  if (0x3fffffffffffffff < uVar6) {
    pLVar11[-2] = 2.066315e-39;
    pLVar11[-1] = 0.0;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = boost::program_options::detail::cmdline::cmdline;
    pLVar11[-2] = 2.066366e-39;
    pLVar11[-1] = 0.0;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a0 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar6 < 0x8001) {
      local_e8 = (RhsScalar *)((long)pLVar11 - (uVar6 * 4 + 0x1e & 0xfffffffffffffff0));
      local_a0 = local_e8;
      pLVar11 = local_e8;
    }
    else {
      pLVar11[-2] = 2.063727e-39;
      pLVar11[-1] = 0.0;
      local_e8 = (RhsScalar *)malloc(uVar6 * 4);
      if (((ulong)local_e8 & 0xf) != 0) {
LAB_0016806c:
        *(undefined8 *)((long)pLVar11 + -8) = 0x16808b;
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_a0 = local_e8;
      if (local_e8 == (RhsScalar *)0x0) {
        pLVar11[-2] = 2.066507e-39;
        pLVar11[-1] = 0.0;
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = boost::program_options::detail::cmdline::cmdline;
        *(undefined1 **)(pLVar11 + -2) = &LAB_001680b9;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_e8 = (RhsScalar *)0x0;
  }
  local_70 = triStride;
  local_f8 = uVar19;
  local_f0 = pLVar4;
  if (manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0') {
    pLVar11[-2] = 2.066383e-39;
    pLVar11[-1] = 0.0;
    iVar3 = __cxa_guard_acquire(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes
                               );
    if (iVar3 != 0) {
      pLVar11[-2] = 2.066411e-39;
      pLVar11[-1] = 0.0;
      CacheSizes::CacheSizes
                ((CacheSizes *)&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes)
      ;
      pLVar11[-2] = 2.066428e-39;
      pLVar11[-1] = 0.0;
      __cxa_guard_release(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes);
      triStride = local_70;
    }
  }
  if (local_60 < 1) {
    pfVar7 = (float *)0x0;
  }
  else {
    lVar10 = size;
    if (size < otherStride) {
      lVar10 = otherStride;
    }
    uVar6 = DAT_001a5508 / (ulong)(lVar10 << 4);
    uVar19 = uVar6 + 3;
    if (-1 < (long)uVar6) {
      uVar19 = uVar6;
    }
    pfVar7 = (float *)(uVar19 & 0xfffffffffffffffc);
  }
  pfVar14 = (float *)0x4;
  if (4 < (long)pfVar7) {
    pfVar14 = pfVar7;
  }
  if (0 < size) {
    local_118 = local_d8 + (size + -1) * triStride + size;
    startTarget = (triStride * 4 ^ 0xfffffffffffffffcU) * local_98;
    local_178 = ~triStride << 5;
    local_190 = triStride * -4;
    local_100 = _other + size;
    local_140 = local_98 * -4;
    local_158 = otherStride * (long)pfVar14 * 4;
    local_110 = size - local_98;
    local_108 = local_d8 + triStride * (size - local_98);
    local_138 = local_98 * triStride * -4;
    local_160 = local_b8 * 4;
    local_120 = pfVar14;
    do {
      uVar19 = size;
      if ((long)local_98 < size) {
        uVar19 = local_98;
      }
      local_78 = uVar19;
      if (0 < local_60) {
        local_150 = size - uVar19;
        local_168 = local_d8 + (size - uVar19);
        local_c0 = local_100;
        lVar10 = 0;
        uVar6 = uVar19;
        do {
          local_e0 = lVar10;
          local_a8 = (float *)(local_60 - lVar10);
          pfVar7 = local_a8;
          if ((long)local_120 < (long)local_a8) {
            pfVar7 = local_120;
          }
          local_c8 = pfVar7;
          uVar19 = uVar6;
          if (0 < (long)uVar6) {
            local_130 = local_a0 + lVar10 * uVar6;
            local_180 = _other + lVar10 * otherStride;
            local_170 = _other + lVar10 * otherStride + local_150;
            local_128 = local_c0;
            local_d0 = local_118;
            pfVar14 = (float *)0x0;
            do {
              stride = local_78;
              cols = local_c8;
              pRVar2 = local_130;
              local_188 = uVar6;
              uVar12 = 8;
              if ((long)uVar6 < 8) {
                uVar12 = uVar6;
              }
              uVar6 = 1;
              if (1 < (long)uVar12) {
                uVar6 = uVar12;
              }
              local_90 = pfVar14;
              lVar15 = uVar19 - (long)pfVar14;
              lVar8 = 8;
              if (lVar15 < 8) {
                lVar8 = lVar15;
              }
              local_88 = lVar8;
              if (0 < lVar15) {
                pfVar9 = local_d0 + -uVar12;
                uVar19 = 0;
                do {
                  if (0 < (long)local_a8) {
                    lVar13 = ~((long)pfVar14 + uVar19) + size;
                    fVar1 = local_d8[lVar13 * triStride + lVar13];
                    pfVar16 = local_128 + -uVar12;
                    lVar17 = local_e0;
                    do {
                      fVar20 = _other[lVar17 * otherStride + lVar13] * (1.0 / fVar1);
                      _other[lVar17 * otherStride + lVar13] = fVar20;
                      if (0 < (long)(~uVar19 + lVar8)) {
                        lVar18 = 0;
                        do {
                          pfVar16[lVar18] = pfVar9[lVar18] * -fVar20 + pfVar16[lVar18];
                          lVar18 = lVar18 + 1;
                        } while (lVar18 < (long)(~uVar19 + lVar8));
                      }
                      lVar17 = lVar17 + 1;
                      pfVar16 = pfVar16 + otherStride;
                    } while (lVar17 < (long)pfVar7 + lVar10);
                  }
                  uVar19 = uVar19 + 1;
                  pfVar9 = (float *)((long)pfVar9 + local_190);
                } while (uVar19 != uVar6);
              }
              lVar15 = lVar15 - lVar8;
              local_80 = size - ((long)pfVar14 + lVar8);
              _auStack_50 = local_180 + local_80;
              *(long *)(pLVar11 + -4) = lVar15;
              pLVar11[-6] = 2.065144e-39;
              pLVar11[-5] = 0.0;
              gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
              ::operator()(&local_51,pRVar2,(blas_data_mapper<float,_long,_0,_0,_1> *)auStack_50,
                           lVar8,(long)cols,stride,*(long *)(pLVar11 + -4));
              pLVar4 = local_68;
              lVar8 = local_88;
              if (0 < lVar15) {
                _auStack_50 = local_168 + local_80 * local_70;
                pLVar11[-4] = 0.0;
                pLVar11[-3] = 0.0;
                local_80 = lVar15;
                pLVar11[-6] = 2.065262e-39;
                pLVar11[-5] = 0.0;
                gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
                ::operator()(local_31,pLVar4,(const_blas_data_mapper<float,_long,_0> *)auStack_50,
                             lVar8,lVar15,0,*(long *)(pLVar11 + -4));
                pLVar4 = local_68;
                lVar15 = local_80;
                pRVar2 = local_130;
                _auStack_50 = local_170;
                *(long *)(pLVar11 + -4) = local_80;
                pLVar11[-6] = 0.0;
                pLVar11[-5] = 0.0;
                *(ulong *)(pLVar11 + -8) = local_78;
                *(long *)(pLVar11 + -10) = lVar8;
                *(float **)(pLVar11 + -0xc) = local_c8;
                pLVar11[-0xe] = 2.06537e-39;
                pLVar11[-0xd] = 0.0;
                gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
                ::operator()(&local_32,(blas_data_mapper<float,_long,_0,_0,_1> *)auStack_50,pLVar4,
                             pRVar2,lVar15,lVar8,*(long *)(pLVar11 + -0xc),-1.0,
                             *(long *)(pLVar11 + -10),*(long *)(pLVar11 + -8),
                             *(long *)(pLVar11 + -6),*(long *)(pLVar11 + -4));
              }
              pfVar14 = local_90 + 2;
              uVar6 = local_188 - 8;
              local_d0 = (float *)((long)local_d0 + local_178);
              local_128 = local_128 + -8;
              uVar19 = local_78;
              triStride = local_70;
            } while ((long)pfVar14 < (long)local_78);
          }
          lVar10 = local_e0 + (long)local_120;
          local_c0 = (float *)((long)local_c0 + local_158);
          uVar6 = uVar19;
        } while (lVar10 < local_60);
      }
      uVar6 = size - local_98;
      if (uVar6 == 0 || size < (long)local_98) break;
      lVar15 = 0;
      lVar10 = local_b8;
      pfVar7 = _other;
      pfVar14 = local_108;
      lVar8 = local_110;
      do {
        pLVar4 = local_68;
        lVar13 = lVar8 - lVar10;
        lVar17 = lVar8;
        if (lVar10 <= lVar8) {
          lVar17 = lVar10;
        }
        lVar8 = lVar13;
        if (0 < lVar17) {
          local_88 = lVar13;
          local_a8 = pfVar7;
          local_90 = pfVar14;
          _auStack_50 = pfVar14;
          pLVar11[-4] = 0.0;
          pLVar11[-3] = 0.0;
          pLVar11[-6] = 2.065744e-39;
          pLVar11[-5] = 0.0;
          gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
          ::operator()(local_31,pLVar4,(const_blas_data_mapper<float,_long,_0> *)auStack_50,uVar19,
                       lVar17,0,*(long *)(pLVar11 + -4));
          _auStack_50 = local_a8;
          pLVar11[-6] = 0.0;
          pLVar11[-5] = 0.0;
          pLVar11[-4] = 0.0;
          pLVar11[-3] = 0.0;
          pLVar11[-8] = -NAN;
          pLVar11[-7] = -NAN;
          pLVar11[-10] = -NAN;
          pLVar11[-9] = -NAN;
          *(long *)(pLVar11 + -0xc) = local_60;
          pLVar4 = local_68;
          uVar19 = local_78;
          pRVar2 = local_a0;
          pLVar11[-0xe] = 2.065877e-39;
          pLVar11[-0xd] = 0.0;
          gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
          ::operator()(&local_32,(blas_data_mapper<float,_long,_0,_0,_1> *)auStack_50,pLVar4,pRVar2,
                       lVar17,uVar19,*(long *)(pLVar11 + -0xc),-1.0,*(long *)(pLVar11 + -10),
                       *(long *)(pLVar11 + -8),*(long *)(pLVar11 + -6),*(long *)(pLVar11 + -4));
          lVar10 = local_b8;
          pfVar7 = local_a8;
          pfVar14 = local_90;
          uVar19 = local_78;
          lVar8 = local_88;
        }
        lVar15 = lVar15 + lVar10;
        pfVar14 = (float *)((long)pfVar14 + local_160);
        pfVar7 = (float *)((long)pfVar7 + local_160);
      } while (lVar15 < (long)uVar6);
      local_118 = (float *)((long)local_118 + startTarget);
      local_100 = (float *)((long)local_100 + local_140);
      local_110 = local_110 - local_98;
      local_108 = (float *)((long)local_108 + local_138);
      size = uVar6;
      triStride = local_70;
    } while (0 < (long)uVar6);
  }
  pRVar2 = local_e8;
  if (0x8000 < local_b0) {
    pLVar11[-2] = 2.066138e-39;
    pLVar11[-1] = 0.0;
    free(pRVar2);
  }
  pLVar4 = local_f0;
  if (0x8000 < local_f8) {
    pLVar11[-2] = 2.066173e-39;
    pLVar11[-1] = 0.0;
    free(pLVar4);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }